

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void toggle_sourceview_cb(Fl_Double_Window *param_1,void *param_2)

{
  Fl_Tabs *this;
  int iVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Fl_Widget *newvalue;
  int local_4c;
  int local_48;
  int tab;
  int autoposition;
  int local_34;
  undefined1 local_30 [4];
  int autorefresh;
  Fl_Preferences svp;
  void *param_1_local;
  Fl_Double_Window *param_0_local;
  
  svp.rootNode = (RootNode *)param_2;
  if (sourceview_panel == (Fl_Double_Window *)0x0) {
    make_sourceview();
    Fl_Widget::callback((Fl_Widget *)sourceview_panel,toggle_sourceview_cb);
    Fl_Preferences::Fl_Preferences((Fl_Preferences *)local_30,&fluid_prefs,"sourceview");
    Fl_Preferences::get((Fl_Preferences *)local_30,"autorefresh",&local_34,1);
    Fl_Button::value(&sv_autorefresh->super_Fl_Button,local_34);
    Fl_Preferences::get((Fl_Preferences *)local_30,"autoposition",&local_48,1);
    Fl_Button::value(&sv_autoposition->super_Fl_Button,local_48);
    Fl_Preferences::get((Fl_Preferences *)local_30,"tab",&local_4c,0);
    iVar1 = local_4c;
    if ((-1 < local_4c) &&
       (iVar3 = Fl_Group::children(&sv_tab->super_Fl_Group), this = sv_tab, iVar1 < iVar3)) {
      newvalue = Fl_Group::child(&sv_tab->super_Fl_Group,local_4c);
      Fl_Tabs::value(this,newvalue);
    }
    cVar2 = position_window(&sourceview_panel->super_Fl_Window,"sourceview_pos",0,0x140,0x78,0x226,
                            500);
    Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_30);
    if (cVar2 == '\0') {
      return;
    }
  }
  uVar4 = Fl_Widget::visible((Fl_Widget *)sourceview_panel);
  if (uVar4 == 0) {
    (*(sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
    Fl_Menu_Item::label(sourceview_item,"Hide Source Code...");
    update_sourceview_cb((Fl_Button *)0x0,(void *)0x0);
  }
  else {
    (*(sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
    Fl_Menu_Item::label(sourceview_item,"Show Source Code...");
  }
  return;
}

Assistant:

void toggle_sourceview_cb(Fl_Double_Window *, void *) {
  if (!sourceview_panel) {
    make_sourceview();
    sourceview_panel->callback((Fl_Callback*)toggle_sourceview_cb);
    Fl_Preferences svp(fluid_prefs, "sourceview");
    int autorefresh;
    svp.get("autorefresh", autorefresh, 1);
    sv_autorefresh->value(autorefresh);
    int autoposition;
    svp.get("autoposition", autoposition, 1);
    sv_autoposition->value(autoposition);
    int tab;
    svp.get("tab", tab, 0);
    if (tab>=0 && tab<sv_tab->children()) sv_tab->value(sv_tab->child(tab));
    if (!position_window(sourceview_panel,"sourceview_pos", 0, 320, 120, 550, 500)) return;
  }

  if (sourceview_panel->visible()) {
    sourceview_panel->hide();
    sourceview_item->label("Show Source Code...");
  } else {
    sourceview_panel->show();
    sourceview_item->label("Hide Source Code...");
    update_sourceview_cb(0,0);
  }
}